

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

int gray_convert_glyph_inner(PWorker worker)

{
  int iVar1;
  int local_14;
  int error;
  PWorker worker_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)worker->jump_buffer);
  if (iVar1 == 0) {
    local_14 = PVG_FT_Outline_Decompose(&worker->outline,worker);
    if (worker->invalid == 0) {
      gray_record_cell(worker);
    }
  }
  else {
    local_14 = -4;
  }
  return local_14;
}

Assistant:

static int
  gray_convert_glyph_inner( RAS_ARG )
  {
    volatile int  error = 0;

    if ( pvg_ft_setjmp( ras.jump_buffer ) == 0 )
    {
      error = PVG_FT_Outline_Decompose( &ras.outline, &ras );
      if ( !ras.invalid )
        gray_record_cell( RAS_VAR );
    }
    else
    {
      error = ErrRaster_Memory_Overflow;
    }

    return error;
  }